

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::DescriptorScalarReplacement::GetReplacementVariable
          (DescriptorScalarReplacement *this,Instruction *var,uint32_t idx)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  uint32_t uVar3;
  _Rb_tree_color _Var4;
  _Rb_tree_iterator<std::pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Var5;
  _Base_ptr p_Var6;
  pair<std::_Rb_tree_iterator<std::pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_bool>
  pVar7;
  allocator_type local_6d;
  value_type_conflict3 local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  
  p_Var1 = &(this->replacement_variables_)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->replacement_variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(Instruction **)(p_Var2 + 1) < var])
  {
    if (*(Instruction **)(p_Var2 + 1) >= var) {
      p_Var6 = p_Var2;
    }
  }
  _Var5._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (_Var5._M_node = p_Var6, var < *(Instruction **)(p_Var6 + 1))) {
    _Var5._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)_Var5._M_node == p_Var1) {
    uVar3 = descsroautil::GetNumberOfElementsForArrayOrStruct((this->super_Pass).context_,var);
    local_6c = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_68,(ulong)uVar3,&local_6c,&local_6d);
    local_50.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_50.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_50.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50.first = var;
    pVar7 = std::
            _Rb_tree<spvtools::opt::Instruction*,std::pair<spvtools::opt::Instruction*const,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::_Select1st<std::pair<spvtools::opt::Instruction*const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::less<spvtools::opt::Instruction*>,std::allocator<std::pair<spvtools::opt::Instruction*const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
            ::
            _M_insert_unique<std::pair<spvtools::opt::Instruction*const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                      ((_Rb_tree<spvtools::opt::Instruction*,std::pair<spvtools::opt::Instruction*const,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::_Select1st<std::pair<spvtools::opt::Instruction*const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::less<spvtools::opt::Instruction*>,std::allocator<std::pair<spvtools::opt::Instruction*const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                        *)&this->replacement_variables_,&local_50);
    _Var5 = pVar7.first._M_node;
    if (local_50.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.second.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.second.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.second.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((&(_Var5._M_node[1]._M_parent)->_M_color)[idx] == _S_red) {
    _Var4 = CreateReplacementVariable(this,var,idx);
    (&(_Var5._M_node[1]._M_parent)->_M_color)[idx] = _Var4;
  }
  return (&(_Var5._M_node[1]._M_parent)->_M_color)[idx];
}

Assistant:

uint32_t DescriptorScalarReplacement::GetReplacementVariable(Instruction* var,
                                                             uint32_t idx) {
  auto replacement_vars = replacement_variables_.find(var);
  if (replacement_vars == replacement_variables_.end()) {
    uint32_t number_of_elements =
        descsroautil::GetNumberOfElementsForArrayOrStruct(context(), var);
    replacement_vars =
        replacement_variables_
            .insert({var, std::vector<uint32_t>(number_of_elements, 0)})
            .first;
  }

  if (replacement_vars->second[idx] == 0) {
    replacement_vars->second[idx] = CreateReplacementVariable(var, idx);
  }

  return replacement_vars->second[idx];
}